

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall soul::StructuralParser::createLiteral(StructuralParser *this,Value *v)

{
  Constant *expression;
  Expression *pEVar1;
  Context local_28;
  
  local_28.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_28.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_28.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_28.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_28.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_28.parentScope = this->currentScope;
  expression = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context,soul::Value&>
                         (&this->allocator->pool,&local_28,v);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.location.sourceCode.object);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::skip(&this->super_SOULTokeniser);
  pEVar1 = parseSuffixes(this,&expression->super_Expression);
  return pEVar1;
}

Assistant:

AST::Expression& createLiteral (Value v)
    {
        auto& lit = allocate<AST::Constant> (getContext(), v);
        skip();
        return parseSuffixes (lit);
    }